

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.hpp
# Opt level: O2

void __thiscall
type_safe::function_ref<int(int,short)>::function_ref<int,int,int>
          (function_ref<int(int,short)> *this,undefined8 param_2)

{
  undefined8 *local_30;
  undefined8 local_28;
  char *local_20;
  undefined4 local_18;
  
  local_30 = &local_28;
  local_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/reference.hpp"
  ;
  local_18 = 0x2ba;
  local_28 = param_2;
  debug_assert::detail::
  do_assert<type_safe::function_ref<int(int,short)>::function_ref<int,int,int>(type_safe::detail::matching_function_pointer_tag,int(*)(int,int))::_lambda()_1_,type_safe::detail::precondition_error_handler,char_const(&)[34]>
            (&local_30,&local_20,"fptr","function pointer must not be null");
  *(undefined8 *)this = local_28;
  *(code **)(this + 8) = invoke_function_pointer<int(*)(int,int),void(*)()>;
  return;
}

Assistant:

function_ref(detail::matching_function_pointer_tag, Return2 (*fptr)(Args2...))
    {
        using pointer_type        = Return2 (*)(Args2...);
        using stored_pointer_type = void (*)();

        DEBUG_ASSERT(fptr, detail::precondition_error_handler{},
                     "function pointer must not be null");
        ::new (storage_.get()) stored_pointer_type(reinterpret_cast<stored_pointer_type>(fptr));

        cb_ = &invoke_function_pointer<pointer_type, stored_pointer_type>;
    }